

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Wln_Ntk_t *pNtk;
  Vec_Int_t *__ptr;
  int *piVar2;
  FILE *__stream;
  char *pcVar3;
  uint fVerbose;
  uint fSkipSimple;
  char *pcVar4;
  uint fDump;
  
  fSkipSimple = 0;
  Extra_UtilGetoptReset();
  fDump = 0;
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"sdvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 100) {
      fDump = fDump ^ 1;
    }
    else {
      if (iVar1 != 0x73) {
        Abc_Print(-2,"usage: %%retime [-sdvh]\n");
        Abc_Print(-2,"\t         performs retiming for the NDR design\n");
        pcVar4 = "yes";
        pcVar3 = "no";
        if (fSkipSimple == 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle printing simple nodes [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fDump == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle dumping the network in Verilog [default = %s]\n",pcVar3);
        if (fVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      fSkipSimple = fSkipSimple ^ 1;
    }
  }
  if (pAbc->pNdr == (void *)0x0) {
    if (globalUtilOptind + 1 == argc) {
      pcVar3 = argv[globalUtilOptind];
      __stream = fopen(pcVar3,"r");
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        Wln_NtkRetimeTest(pcVar3,fSkipSimple,fDump,fVerbose);
        return 0;
      }
      Abc_Print(1,"Cannot open input file \"%s\". ",pcVar3);
      pcVar3 = Extra_FileGetSimilarName
                         (pcVar3,".ndr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (pcVar3 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
      }
      Abc_Print(1,"\n");
      return 0;
    }
    pcVar3 = "Abc_CommandRetime(): Input file name should be given on the command line.";
  }
  else {
    pNtk = Wln_NtkFromNdr(pAbc->pNdr,fDump);
    Wln_NtkRetimeCreateDelayInfo(pNtk);
    if (pNtk != (Wln_Ntk_t *)0x0) {
      __ptr = Wln_NtkRetime(pNtk,fSkipSimple,fVerbose);
      Wln_NtkFree(pNtk);
      if (pAbc->pNdrArray != (int *)0x0) {
        free(pAbc->pNdrArray);
        pAbc->pNdrArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        iVar1 = __ptr->nSize;
        piVar2 = (int *)malloc((long)iVar1 * 4 + 4);
        *piVar2 = iVar1 + 1;
        memcpy(piVar2 + 1,__ptr->pArray,(long)iVar1 << 2);
        pAbc->pNdrArray = piVar2;
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (int *)0x0;
        }
        free(__ptr);
        return 0;
      }
      return 0;
    }
    pcVar3 = "Transforming NDR into internal represnetation has failed.";
  }
  puts(pcVar3);
  return 0;
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fOneStep;
    int fUseOldNames;
    int fVerbose;
    int Mode;
    int nDelayLim;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Mode      =  5;
    nDelayLim =  0;
    fForward  =  0;
    fBackward =  0;
    fOneStep  =  0;
    fUseOldNames = 0;
    fVerbose  =  0;
    nMaxIters = 15;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfbsovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            Mode = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Mode < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nDelayLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelayLim < 0 )
                goto usage;
            break;
        case 'f':
            fForward ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 's':
            fOneStep ^= 1;
            break;
        case 'o':
            fUseOldNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Mode < 0 || Mode > 6 )
    {
        Abc_Print( -1, "The mode (%d) is incorrect. Retiming is not performed.\n", Mode );
        return 0;
    }

    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( Abc_NtkGetChoiceNum(pNtk) )
        {
            Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
            return 0;
        }
        // convert the network into an SOP network
        pNtkRes = Abc_NtkToLogic( pNtk );
        // perform the retiming
        Abc_NtkRetime( pNtkRes, Mode, nDelayLim, fForward, fBackward, fOneStep, fUseOldNames, fVerbose );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }

    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        Abc_Print( -1, "Converting to SOPs has failed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The network is not a logic network. Retiming is not performed.\n" );
        return 0;
    }

    // perform the retiming
    Abc_NtkRetime( pNtk, Mode, nDelayLim, fForward, fBackward, fOneStep, fUseOldNames, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: retime [-MD num] [-fbsovh]\n" );
    Abc_Print( -2, "\t         retimes the current network using one of the algorithms:\n" );
    Abc_Print( -2, "\t             1: most forward retiming\n" );
    Abc_Print( -2, "\t             2: most backward retiming\n" );
    Abc_Print( -2, "\t             3: forward and backward min-area retiming\n" );
    Abc_Print( -2, "\t             4: forward and backward min-delay retiming\n" );
    Abc_Print( -2, "\t             5: mode 3 followed by mode 4\n" );
    Abc_Print( -2, "\t             6: Pan's optimum-delay retiming using binary search\n" );
    Abc_Print( -2, "\t-M num : the retiming algorithm to use [default = %d]\n", Mode );
    Abc_Print( -2, "\t-D num : the minimum delay target (0=unused) [default = %d]\n", nDelayLim );
    Abc_Print( -2, "\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-s     : enables retiming one step only in mode 4 [default = %s]\n", fOneStep? "yes": "no" );
    Abc_Print( -2, "\t-o     : enables usind old flop naming conventions [default = %s]\n", fUseOldNames? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
//    Abc_Print( -2, "\t-I num : max number of iterations of l-value computation [default = %d]\n", nMaxIters );
//    Abc_Print( -2, "\t-f     : toggle forward retiming (for AIGs) [default = %s]\n", fForward? "yes": "no" );
//    Abc_Print( -2, "\t-b     : toggle backward retiming (for AIGs) [default = %s]\n", fBackward? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle computation of initial state [default = %s]\n", fInitial? "yes": "no" );
}